

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::CloseElement(XMLPrinter *this,bool compactMode)

{
  int iVar1;
  char *pcVar2;
  
  this->_depth = this->_depth + -1;
  iVar1 = (this->_stack)._size;
  (this->_stack)._size = iVar1 + -1;
  if (this->_elementJustOpened == true) {
    Print(this,"/>");
  }
  else {
    pcVar2 = (this->_stack)._mem[(long)iVar1 + -1];
    if (this->_textDepth < 0 && !compactMode) {
      Print(this,"\n");
      (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
    }
    Print(this,"</%s>",pcVar2);
  }
  if (this->_textDepth == this->_depth) {
    this->_textDepth = -1;
  }
  if (this->_depth == 0 && !compactMode) {
    Print(this,"\n");
  }
  this->_elementJustOpened = false;
  return;
}

Assistant:

void XMLPrinter::CloseElement( bool compactMode )
{
    --_depth;
    const char* name = _stack.Pop();

    if ( _elementJustOpened ) {
        Print( "/>" );
    }
    else {
        if ( _textDepth < 0 && !compactMode) {
            Print( "\n" );
            PrintSpace( _depth );
        }
        Print( "</%s>", name );
    }

    if ( _textDepth == _depth ) {
        _textDepth = -1;
    }
    if ( _depth == 0 && !compactMode) {
        Print( "\n" );
    }
    _elementJustOpened = false;
}